

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_file_twice(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char path [25];
  uv_timer_t timer;
  uv_fs_event_t watchers [2];
  
  builtin_strncpy(path + 0x10,"pty_file",9);
  builtin_strncpy(path,"test/fixtures/em",0x10);
  uVar2 = uv_default_loop();
  timer.data = watchers;
  iVar1 = uv_fs_event_init(uVar2);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(watchers,fail_cb,path,0);
    if (iVar1 == 0) {
      iVar1 = uv_fs_event_init(uVar2,watchers + 1);
      if (iVar1 == 0) {
        iVar1 = uv_fs_event_start(watchers + 1,fail_cb,path,0);
        if (iVar1 == 0) {
          iVar1 = uv_timer_init(uVar2,&timer);
          if (iVar1 == 0) {
            iVar1 = uv_timer_start(&timer,timer_cb_watch_twice,10,0);
            if (iVar1 == 0) {
              iVar1 = uv_run(uVar2,0);
              if (iVar1 == 0) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0x2b5;
              }
              else {
                pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                uVar2 = 0x2b3;
              }
            }
            else {
              pcVar3 = "0 == uv_timer_start(&timer, timer_cb_watch_twice, 10, 0)";
              uVar2 = 0x2b2;
            }
          }
          else {
            pcVar3 = "0 == uv_timer_init(loop, &timer)";
            uVar2 = 0x2b1;
          }
        }
        else {
          pcVar3 = "0 == uv_fs_event_start(watchers + 1, fail_cb, path, 0)";
          uVar2 = 0x2b0;
        }
      }
      else {
        pcVar3 = "0 == uv_fs_event_init(loop, watchers + 1)";
        uVar2 = 0x2af;
      }
    }
    else {
      pcVar3 = "0 == uv_fs_event_start(watchers + 0, fail_cb, path, 0)";
      uVar2 = 0x2ae;
    }
  }
  else {
    pcVar3 = "0 == uv_fs_event_init(loop, watchers + 0)";
    uVar2 = 0x2ad;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_twice) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  const char path[] = "test/fixtures/empty_file";
  uv_fs_event_t watchers[2];
  uv_timer_t timer;
  uv_loop_t* loop;

  loop = uv_default_loop();
  timer.data = watchers;

  ASSERT(0 == uv_fs_event_init(loop, watchers + 0));
  ASSERT(0 == uv_fs_event_start(watchers + 0, fail_cb, path, 0));
  ASSERT(0 == uv_fs_event_init(loop, watchers + 1));
  ASSERT(0 == uv_fs_event_start(watchers + 1, fail_cb, path, 0));
  ASSERT(0 == uv_timer_init(loop, &timer));
  ASSERT(0 == uv_timer_start(&timer, timer_cb_watch_twice, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}